

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HierarchicalTaskNetworkComponent.cpp
# Opt level: O0

void __thiscall
AI::HierarchicalTaskNetworkComponent::fixedTick(HierarchicalTaskNetworkComponent *this,float dt)

{
  mapped_type *pmVar1;
  mapped_type *pmVar2;
  World *pWVar3;
  mapped_type *this_00;
  Vector3 VVar4;
  byte local_d1;
  key_type local_bc [2];
  key_type local_b4;
  TaskDatabase *local_b0;
  TaskDatabase *tasks;
  GameMode *gameMode;
  float local_98;
  GameMode *local_90;
  float local_88;
  key_type local_80;
  key_type local_7c;
  Actor *local_78;
  Actor *player;
  Vector3 local_68;
  undefined8 local_58;
  float local_50;
  key_type local_4c;
  Vector3 local_48;
  undefined8 local_38;
  float local_30;
  GameMode *local_28;
  Vector3 eyePosition;
  mapped_type playerIdentified;
  float dt_local;
  HierarchicalTaskNetworkComponent *this_local;
  
  eyePosition.y = 4.2039e-45;
  pmVar1 = std::
           map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
           ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                         *)&this->state,(key_type *)&eyePosition.y);
  eyePosition.z._3_1_ = *pmVar1 & 1;
  sense(this);
  perceive(this);
  purgeMemoryOfIgnoredActors(this);
  produceFacts(this);
  tickEmotionalState(this,dt);
  VVar4 = Actor::GetActorLocation((this->super_Component).owner);
  local_48.z = VVar4.z;
  local_30 = local_48.z;
  local_48._0_8_ = VVar4._0_8_;
  local_38._0_4_ = local_48.x;
  local_38._4_4_ = local_48.y;
  local_4c = CurrentPosition;
  local_48 = VVar4;
  pmVar2 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](&(this->state).current.vectors,&local_4c);
  pmVar2->z = local_30;
  pmVar2->x = (float)(undefined4)local_38;
  pmVar2->y = (float)local_38._4_4_;
  VVar4 = Actor::GetActorLocation((this->super_Component).owner);
  local_68._0_8_ = VVar4._0_8_;
  local_58._0_4_ = local_68.x;
  local_58._4_4_ = local_68.y;
  local_68.z = VVar4.z;
  local_50 = local_68.z;
  player._4_4_ = 6;
  local_68 = VVar4;
  pmVar2 = std::
           map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
           ::operator[](&(this->state).current.vectors,(key_type *)((long)&player + 4));
  pmVar2->x = (float)(undefined4)local_58;
  pmVar2->y = (float)local_58._4_4_;
  pmVar2->z = local_50;
  pWVar3 = Component::getWorld(&this->super_Component);
  local_78 = GameplayStatics::GetPlayerCharacter(pWVar3,0);
  if (local_78 != (Actor *)0x0) {
    local_7c = PlayerIdentified;
    pmVar1 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)&this->state,&local_7c);
    if ((*pmVar1 & 1U) != 0) {
      local_80 = PlayerPosition;
      pmVar2 = std::
               map<WorldStateIdentifier,_Math::Vector3,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_Math::Vector3>_>_>
               ::operator[](&(this->state).current.vectors,&local_80);
      pmVar2->z = eyePosition.x;
      *(GameMode **)pmVar2 = local_28;
      local_88 = eyePosition.x;
      local_90 = local_28;
      local_98 = eyePosition.x;
      gameMode = local_28;
      VVar4.z = eyePosition.x;
      VVar4._0_8_ = local_28;
      WorldState::produceFactVector(&this->state,Player_LastKnownLocation,VVar4);
    }
  }
  decide(this);
  performTask(this,dt);
  pWVar3 = Component::getWorld(&this->super_Component);
  tasks = (TaskDatabase *)World::getAuthGameMode(pWVar3);
  local_b0 = GameMode::getAvailableTasks((GameMode *)tasks);
  evaluatePlan(&(this->planner).plan,&this->state,&this->worldQuerySystem,
               &(this->planner).parameters,&local_b0->satisfiablePredicates);
  if ((this->isBeingDebugViewed & 1U) != 0) {
    updateHUD_PlanPath(this);
  }
  local_b4 = PlayerIdentified;
  this_00 = std::
            map<WorldStateIdentifier,_ValueOverTimeTracker,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_ValueOverTimeTracker>_>_>
            ::operator[](&(this->state).valueTrackers,&local_b4);
  local_bc[1] = 3;
  pmVar1 = std::
           map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
           ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                         *)&this->state,local_bc + 1);
  ValueOverTimeTracker::update(this_00,(float)(*pmVar1 & 1),dt);
  local_d1 = 0;
  if ((eyePosition.z._3_1_ & 1) == 0) {
    local_bc[0] = PlayerIdentified;
    pmVar1 = std::
             map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
             ::operator[]((map<WorldStateIdentifier,_bool,_std::less<WorldStateIdentifier>,_std::allocator<std::pair<const_WorldStateIdentifier,_bool>_>_>
                           *)&this->state,local_bc);
    local_d1 = *pmVar1;
  }
  if ((local_d1 & 1) != 0) {
    WorldState::produceFactFlag(&this->state,PlayerRecentlyIdentified,true);
  }
  Barker::update(&this->barker,dt);
  return;
}

Assistant:

void HierarchicalTaskNetworkComponent::fixedTick(float dt)
{
	auto playerIdentified = state.current.flags[WorldStateIdentifier::PlayerIdentified];

	sense();
	perceive();
	purgeMemoryOfIgnoredActors();
	produceFacts();

	tickEmotionalState(dt);

	Math::Vector3 eyePosition;
	//FRotator rotation;
	//AIOwner->GetCharacter()->GetActorEyesViewPoint(eyePosition, rotation);	
	state.current.vectors[WorldStateIdentifier::CurrentPosition] = owner->GetActorLocation(); //eyePosition;

	state.current.vectors[WorldStateIdentifier::CurrentPosition_Feet] = owner->GetActorLocation();
	//state.current.vectors[WorldStateIdentifier::CurrentPosition_Feet].z -= Cast<AAICharacter>(AIOwner->GetPawn())->GetCapsuleComponent()->GetScaledCapsuleHalfHeight();

	auto player = GameplayStatics::GetPlayerCharacter(getWorld(), 0);
	if (player != nullptr)
	{
		//player->GetActorEyesViewPoint(eyePosition, rotation);

		if (state.current.flags[WorldStateIdentifier::PlayerIdentified])
		{
			state.current.vectors[WorldStateIdentifier::PlayerPosition] = eyePosition;
			state.produceFactVector(ConsumableFact::Player_LastKnownLocation, eyePosition);	
		}
	}	

	decide();
	performTask(dt);

	auto gameMode = getWorld()->getAuthGameMode();
	auto& tasks = gameMode->getAvailableTasks();
	
	evaluatePlan(planner.plan, state, worldQuerySystem, planner.parameters, tasks.satisfiablePredicates);		

	if (isBeingDebugViewed)
	{
		updateHUD_PlanPath();	
	}	

	state.valueTrackers[WorldStateIdentifier::PlayerIdentified].update(state.current.flags[WorldStateIdentifier::PlayerIdentified], dt);
	if (!playerIdentified && state.current.flags[WorldStateIdentifier::PlayerIdentified])
	{
		state.produceFactFlag(ConsumableFact::PlayerRecentlyIdentified, true);
	}

	barker.update(dt);
}